

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_optimize_reorder_draw_order_list.hpp
# Opt level: O0

void __thiscall
PatchOptimizeReorderDrawOrderList::inject_code
          (PatchOptimizeReorderDrawOrderList *this,ROM *rom,World *world)

{
  initializer_list<md::AddressRegister> __l;
  initializer_list<md::DataRegister> __l_00;
  initializer_list<md::AddressRegister> __l_01;
  initializer_list<md::DataRegister> __l_02;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  size_type sVar1;
  LandstalkerException *this_01;
  allocator<char> local_be1;
  string local_be0;
  allocator<char> local_bb9;
  string local_bb8;
  Register local_b98;
  allocator<char> local_b81;
  string local_b80;
  allocator<char> local_b59;
  string local_b58;
  Register local_b38;
  allocator<char> local_b21;
  string local_b20;
  DataRegister local_b00;
  AddressRegister local_af0;
  AddressInRegister local_ae0;
  DataRegister local_ac0;
  AddressRegister local_ab0;
  AddressInRegister local_aa0;
  DataRegister local_a80;
  AddressRegister local_a70;
  AddressInRegister local_a60;
  DataRegister local_a40;
  AddressRegister local_a30;
  AddressInRegister local_a20;
  AddressRegister local_a00;
  DataRegister local_9f0;
  AddressRegister local_9e0;
  AddressWithIndex local_9d0;
  DataRegister local_9b0;
  DataRegister local_9a0;
  AddressRegister local_990;
  AddressInRegister local_980;
  DataRegister local_960;
  AddressRegister local_950;
  AddressInRegister local_940;
  DataRegister local_920;
  allocator<char> local_909;
  string local_908;
  allocator<char> local_8e1;
  string local_8e0;
  DataRegister local_8c0;
  DataRegister local_8b0;
  AddressRegister local_8a0;
  AddressWithIndex local_890;
  DataRegister local_870;
  DataRegister local_860;
  AddressRegister local_850;
  AddressWithIndex local_840;
  allocator<char> local_819;
  string local_818;
  DataRegister local_7f8;
  DataRegister local_7e8;
  AddressRegister local_7d8;
  AddressWithIndex local_7c8;
  allocator<char> local_7a1;
  string local_7a0;
  DataRegister local_780;
  DataRegister local_770;
  AddressRegister local_760;
  AddressWithIndex local_750;
  allocator<char> local_729;
  string local_728;
  DataRegister local_708;
  DataRegister local_6f8;
  AddressRegister local_6e8;
  AddressWithIndex local_6d8;
  allocator<char> local_6b1;
  string local_6b0;
  DataRegister local_690;
  DataRegister local_680;
  AddressRegister local_670;
  AddressWithIndex local_660;
  allocator<char> local_639;
  string local_638;
  DataRegister local_618;
  AddressRegister local_608;
  AddressInRegister local_5f8;
  allocator<char> local_5d1;
  string local_5d0;
  DataRegister local_5b0;
  AddressRegister local_5a0;
  AddressInRegister local_590;
  DataRegister local_570;
  AddressRegister local_560;
  AddressInRegister local_550;
  DataRegister local_530;
  AddressRegister local_520;
  AddressInRegister local_510;
  DataRegister local_4f0;
  AddressRegister local_4e0;
  AddressInRegister local_4d0;
  AddressRegister local_4b0;
  DataRegister local_4a0;
  AddressRegister local_490;
  AddressWithIndex local_480;
  allocator<char> local_459;
  string local_458;
  allocator<md::AddressRegister> local_431;
  AddressRegister local_430;
  AddressRegister local_420;
  AddressRegister local_410;
  AddressRegister local_400;
  AddressRegister local_3f0;
  AddressRegister local_3e0;
  AddressRegister local_3d0;
  iterator local_3c0;
  size_type local_3b8;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_3b0;
  allocator<md::DataRegister> local_391;
  DataRegister local_390;
  DataRegister local_380;
  DataRegister local_370;
  DataRegister local_360;
  DataRegister local_350;
  DataRegister local_340;
  DataRegister local_330;
  DataRegister local_320;
  iterator local_310;
  size_type local_308;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_300;
  allocator<char> local_2e1;
  string local_2e0;
  DataRegister local_2c0;
  AddressRegister local_2b0;
  AddressInRegister local_2a0;
  Register local_280;
  AddressRegister local_270;
  AddressRegister local_260;
  allocator<char> local_249;
  string local_248;
  Param local_228 [2];
  AddressRegister local_218;
  AddressRegister local_208;
  allocator<md::AddressRegister> local_1f1;
  AddressRegister local_1f0;
  AddressRegister local_1e0;
  AddressRegister local_1d0;
  AddressRegister local_1c0;
  AddressRegister local_1b0;
  AddressRegister local_1a0;
  AddressRegister local_190;
  iterator local_180;
  size_type local_178;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_170;
  allocator<md::DataRegister> local_155 [13];
  DataRegister local_148;
  DataRegister local_138;
  DataRegister local_128;
  DataRegister local_118;
  DataRegister local_108;
  DataRegister local_f8;
  DataRegister local_e8;
  DataRegister local_d8;
  iterator local_c8;
  size_type local_c0;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_b8;
  undefined1 local_a0 [8];
  Code func;
  uint8_t ZPos;
  uint8_t HitBoxYEnd;
  uint8_t HitBoxYStart;
  uint8_t HitBoxXEnd;
  uint8_t HitBoxXStart;
  World *world_local;
  ROM *rom_local;
  PatchOptimizeReorderDrawOrderList *this_local;
  
  func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0x18;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 0x1a;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ = 0x1c;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count._4_1_ = 0x1e;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = 0x12;
  md::Code::Code((Code *)local_a0);
  md::DataRegister::DataRegister(&local_148,'\0');
  md::DataRegister::DataRegister(&local_138,'\x01');
  md::DataRegister::DataRegister(&local_128,'\x02');
  md::DataRegister::DataRegister(&local_118,'\x03');
  md::DataRegister::DataRegister(&local_108,'\x04');
  md::DataRegister::DataRegister(&local_f8,'\x05');
  md::DataRegister::DataRegister(&local_e8,'\x06');
  md::DataRegister::DataRegister(&local_d8,'\a');
  local_c8 = &local_148;
  local_c0 = 8;
  std::allocator<md::DataRegister>::allocator(local_155);
  __l_02._M_len = local_c0;
  __l_02._M_array = local_c8;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_b8,__l_02,local_155);
  md::AddressRegister::AddressRegister(&local_1f0,'\0');
  md::AddressRegister::AddressRegister(&local_1e0,'\x01');
  md::AddressRegister::AddressRegister(&local_1d0,'\x02');
  md::AddressRegister::AddressRegister(&local_1c0,'\x03');
  md::AddressRegister::AddressRegister(&local_1b0,'\x04');
  md::AddressRegister::AddressRegister(&local_1a0,'\x05');
  md::AddressRegister::AddressRegister(&local_190,'\x06');
  local_180 = &local_1f0;
  local_178 = 7;
  std::allocator<md::AddressRegister>::allocator(&local_1f1);
  __l_01._M_len = local_178;
  __l_01._M_array = local_180;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_170,__l_01,&local_1f1);
  md::Code::movem_to_stack((Code *)local_a0,&local_b8,&local_170);
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~vector(&local_170);
  std::allocator<md::AddressRegister>::~allocator(&local_1f1);
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::~vector(&local_b8);
  std::allocator<md::DataRegister>::~allocator(local_155);
  md::AddressRegister::AddressRegister(&local_208,'\x05');
  md::Code::lea((Code *)local_a0,0xff5400,&local_208);
  md::AddressRegister::AddressRegister(&local_218,'\0');
  md::Code::lea((Code *)local_a0,0xff11de,&local_218);
  addr_<void>((uint32_t)local_228,0xff11fe);
  md::Code::movew((Code *)local_a0,0xffff,local_228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,"loop_entity_1",&local_249);
  md::Code::label((Code *)local_a0,&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  md::AddressRegister::AddressRegister(&local_260,'\0');
  md::AddressRegister::AddressRegister(&local_270,'\x01');
  md::Code::movel((Code *)local_a0,(Param *)&local_260,(Param *)&local_270);
  md::AddressRegister::AddressRegister((AddressRegister *)&local_280,'\x01');
  md::Code::addql((Code *)local_a0,'\x02',&local_280);
  md::AddressRegister::AddressRegister(&local_2b0,'\0');
  addr_<void>(&local_2a0,&local_2b0);
  md::DataRegister::DataRegister(&local_2c0,'\0');
  md::Code::movew((Code *)local_a0,&local_2a0.super_Param,(Param *)&local_2c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e0,"no_ret",&local_2e1);
  md::Code::bpl((Code *)local_a0,&local_2e0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::allocator<char>::~allocator(&local_2e1);
  md::DataRegister::DataRegister(&local_390,'\0');
  md::DataRegister::DataRegister(&local_380,'\x01');
  md::DataRegister::DataRegister(&local_370,'\x02');
  md::DataRegister::DataRegister(&local_360,'\x03');
  md::DataRegister::DataRegister(&local_350,'\x04');
  md::DataRegister::DataRegister(&local_340,'\x05');
  md::DataRegister::DataRegister(&local_330,'\x06');
  md::DataRegister::DataRegister(&local_320,'\a');
  local_310 = &local_390;
  local_308 = 8;
  std::allocator<md::DataRegister>::allocator(&local_391);
  __l_00._M_len = local_308;
  __l_00._M_array = local_310;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_300,__l_00,&local_391);
  md::AddressRegister::AddressRegister(&local_430,'\0');
  md::AddressRegister::AddressRegister(&local_420,'\x01');
  md::AddressRegister::AddressRegister(&local_410,'\x02');
  md::AddressRegister::AddressRegister(&local_400,'\x03');
  md::AddressRegister::AddressRegister(&local_3f0,'\x04');
  md::AddressRegister::AddressRegister(&local_3e0,'\x05');
  md::AddressRegister::AddressRegister(&local_3d0,'\x06');
  local_3c0 = &local_430;
  local_3b8 = 7;
  std::allocator<md::AddressRegister>::allocator(&local_431);
  __l._M_len = local_3b8;
  __l._M_array = local_3c0;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_3b0,__l,&local_431);
  md::Code::movem_from_stack((Code *)local_a0,&local_300,&local_3b0);
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~vector(&local_3b0);
  std::allocator<md::AddressRegister>::~allocator(&local_431);
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::~vector(&local_300);
  std::allocator<md::DataRegister>::~allocator(&local_391);
  md::Code::rts((Code *)local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_458,"no_ret",&local_459);
  md::Code::label((Code *)local_a0,&local_458);
  std::__cxx11::string::~string((string *)&local_458);
  std::allocator<char>::~allocator(&local_459);
  md::AddressRegister::AddressRegister(&local_490,'\x05');
  md::DataRegister::DataRegister(&local_4a0,'\0');
  addrw_<void>(&local_480,&local_490,&local_4a0,'\x18');
  md::AddressRegister::AddressRegister(&local_4b0,'\x03');
  md::Code::lea((Code *)local_a0,&local_480.super_Param,&local_4b0);
  md::AddressRegister::AddressRegister(&local_4e0,'\x03');
  addr_postinc_<void>(&local_4d0,&local_4e0);
  md::DataRegister::DataRegister(&local_4f0,'\x02');
  md::Code::movew((Code *)local_a0,&local_4d0.super_Param,(Param *)&local_4f0);
  md::AddressRegister::AddressRegister(&local_520,'\x03');
  addr_postinc_<void>(&local_510,&local_520);
  md::DataRegister::DataRegister(&local_530,'\x03');
  md::Code::movew((Code *)local_a0,&local_510.super_Param,(Param *)&local_530);
  md::AddressRegister::AddressRegister(&local_560,'\x03');
  addr_postinc_<void>(&local_550,&local_560);
  md::DataRegister::DataRegister(&local_570,'\x04');
  md::Code::movew((Code *)local_a0,&local_550.super_Param,(Param *)&local_570);
  md::AddressRegister::AddressRegister(&local_5a0,'\x03');
  addr_<void>(&local_590,&local_5a0);
  md::DataRegister::DataRegister(&local_5b0,'\x05');
  md::Code::movew((Code *)local_a0,&local_590.super_Param,(Param *)&local_5b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5d0,"loop_entity_2",&local_5d1);
  md::Code::label((Code *)local_a0,&local_5d0);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::allocator<char>::~allocator(&local_5d1);
  md::AddressRegister::AddressRegister(&local_608,'\x01');
  addr_<void>(&local_5f8,&local_608);
  md::DataRegister::DataRegister(&local_618,'\x01');
  md::Code::movew((Code *)local_a0,&local_5f8.super_Param,(Param *)&local_618);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_638,"next_loop_entity_1",&local_639);
  md::Code::bmi((Code *)local_a0,&local_638);
  std::__cxx11::string::~string((string *)&local_638);
  std::allocator<char>::~allocator(&local_639);
  md::AddressRegister::AddressRegister(&local_670,'\x05');
  md::DataRegister::DataRegister(&local_680,'\x01');
  addrw_<void>(&local_660,&local_670,&local_680,'\x1a');
  md::DataRegister::DataRegister(&local_690,'\x02');
  md::Code::cmpw((Code *)local_a0,&local_660.super_Param,&local_690);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6b0,"next_loop_entity_2",&local_6b1);
  md::Code::bcc((Code *)local_a0,&local_6b0);
  std::__cxx11::string::~string((string *)&local_6b0);
  std::allocator<char>::~allocator(&local_6b1);
  md::AddressRegister::AddressRegister(&local_6e8,'\x05');
  md::DataRegister::DataRegister(&local_6f8,'\x01');
  addrw_<void>(&local_6d8,&local_6e8,&local_6f8,'\x1e');
  md::DataRegister::DataRegister(&local_708,'\x04');
  md::Code::cmpw((Code *)local_a0,&local_6d8.super_Param,&local_708);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_728,"next_loop_entity_2",&local_729);
  md::Code::bcc((Code *)local_a0,&local_728);
  std::__cxx11::string::~string((string *)&local_728);
  std::allocator<char>::~allocator(&local_729);
  md::AddressRegister::AddressRegister(&local_760,'\x05');
  md::DataRegister::DataRegister(&local_770,'\x01');
  addrw_<void>(&local_750,&local_760,&local_770,'\x18');
  md::DataRegister::DataRegister(&local_780,'\x03');
  md::Code::cmpw((Code *)local_a0,&local_750.super_Param,&local_780);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7a0,"swap_a0_a1",&local_7a1);
  md::Code::bls((Code *)local_a0,&local_7a0);
  std::__cxx11::string::~string((string *)&local_7a0);
  std::allocator<char>::~allocator(&local_7a1);
  md::AddressRegister::AddressRegister(&local_7d8,'\x05');
  md::DataRegister::DataRegister(&local_7e8,'\x01');
  addrw_<void>(&local_7c8,&local_7d8,&local_7e8,'\x1c');
  md::DataRegister::DataRegister(&local_7f8,'\x05');
  md::Code::cmpw((Code *)local_a0,&local_7c8.super_Param,&local_7f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_818,"swap_a0_a1",&local_819);
  md::Code::bls((Code *)local_a0,&local_818);
  std::__cxx11::string::~string((string *)&local_818);
  std::allocator<char>::~allocator(&local_819);
  md::AddressRegister::AddressRegister(&local_850,'\x05');
  md::DataRegister::DataRegister(&local_860,'\0');
  addrw_<void>(&local_840,&local_850,&local_860,'\x12');
  md::DataRegister::DataRegister(&local_870,'\x06');
  md::Code::movew((Code *)local_a0,&local_840.super_Param,(Param *)&local_870);
  md::AddressRegister::AddressRegister(&local_8a0,'\x05');
  md::DataRegister::DataRegister(&local_8b0,'\x01');
  addrw_<void>(&local_890,&local_8a0,&local_8b0,'\x12');
  md::DataRegister::DataRegister(&local_8c0,'\x06');
  md::Code::cmpw((Code *)local_a0,&local_890.super_Param,&local_8c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8e0,"next_loop_entity_2",&local_8e1);
  md::Code::bcc((Code *)local_a0,&local_8e0);
  std::__cxx11::string::~string((string *)&local_8e0);
  std::allocator<char>::~allocator(&local_8e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_908,"swap_a0_a1",&local_909);
  md::Code::label((Code *)local_a0,&local_908);
  std::__cxx11::string::~string((string *)&local_908);
  std::allocator<char>::~allocator(&local_909);
  md::DataRegister::DataRegister(&local_920,'\x01');
  md::AddressRegister::AddressRegister(&local_950,'\0');
  addr_<void>(&local_940,&local_950);
  md::Code::movew((Code *)local_a0,(Param *)&local_920,&local_940.super_Param);
  md::DataRegister::DataRegister(&local_960,'\0');
  md::AddressRegister::AddressRegister(&local_990,'\x01');
  addr_<void>(&local_980,&local_990);
  md::Code::movew((Code *)local_a0,(Param *)&local_960,&local_980.super_Param);
  md::DataRegister::DataRegister(&local_9a0,'\x01');
  md::DataRegister::DataRegister(&local_9b0,'\0');
  md::Code::movew((Code *)local_a0,(Param *)&local_9a0,(Param *)&local_9b0);
  md::AddressRegister::AddressRegister(&local_9e0,'\x05');
  md::DataRegister::DataRegister(&local_9f0,'\0');
  addrw_<void>(&local_9d0,&local_9e0,&local_9f0,'\x18');
  md::AddressRegister::AddressRegister(&local_a00,'\x03');
  md::Code::lea((Code *)local_a0,&local_9d0.super_Param,&local_a00);
  md::AddressRegister::AddressRegister(&local_a30,'\x03');
  addr_postinc_<void>(&local_a20,&local_a30);
  md::DataRegister::DataRegister(&local_a40,'\x02');
  md::Code::movew((Code *)local_a0,&local_a20.super_Param,(Param *)&local_a40);
  md::AddressRegister::AddressRegister(&local_a70,'\x03');
  addr_postinc_<void>(&local_a60,&local_a70);
  md::DataRegister::DataRegister(&local_a80,'\x03');
  md::Code::movew((Code *)local_a0,&local_a60.super_Param,(Param *)&local_a80);
  md::AddressRegister::AddressRegister(&local_ab0,'\x03');
  addr_postinc_<void>(&local_aa0,&local_ab0);
  md::DataRegister::DataRegister(&local_ac0,'\x04');
  md::Code::movew((Code *)local_a0,&local_aa0.super_Param,(Param *)&local_ac0);
  md::AddressRegister::AddressRegister(&local_af0,'\x03');
  addr_<void>(&local_ae0,&local_af0);
  md::DataRegister::DataRegister(&local_b00,'\x05');
  md::Code::movew((Code *)local_a0,&local_ae0.super_Param,(Param *)&local_b00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b20,"next_loop_entity_2",&local_b21);
  md::Code::label((Code *)local_a0,&local_b20);
  std::__cxx11::string::~string((string *)&local_b20);
  std::allocator<char>::~allocator(&local_b21);
  md::AddressRegister::AddressRegister((AddressRegister *)&local_b38,'\x01');
  md::Code::addql((Code *)local_a0,'\x02',&local_b38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b58,"loop_entity_2",&local_b59);
  md::Code::bra((Code *)local_a0,&local_b58);
  std::__cxx11::string::~string((string *)&local_b58);
  std::allocator<char>::~allocator(&local_b59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b80,"next_loop_entity_1",&local_b81);
  md::Code::label((Code *)local_a0,&local_b80);
  std::__cxx11::string::~string((string *)&local_b80);
  std::allocator<char>::~allocator(&local_b81);
  md::AddressRegister::AddressRegister((AddressRegister *)&local_b98,'\0');
  md::Code::addql((Code *)local_a0,'\x02',&local_b98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_bb8,"loop_entity_1",&local_bb9);
  md::Code::bra((Code *)local_a0,&local_bb8);
  std::__cxx11::string::~string((string *)&local_bb8);
  std::allocator<char>::~allocator(&local_bb9);
  md::ROM::set_code(rom,0x49c0,(Code *)local_a0);
  this_00 = md::Code::get_bytes((Code *)local_a0);
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this_00);
  if (0x4a3a < sVar1 + 0x49c0) {
    this_01 = (LandstalkerException *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_be0,
               "Replacement function is too large and is overlapping other code!",&local_be1);
    LandstalkerException::LandstalkerException(this_01,&local_be0);
    __cxa_throw(this_01,&LandstalkerException::typeinfo,LandstalkerException::~LandstalkerException)
    ;
  }
  md::Code::~Code((Code *)local_a0);
  return;
}

Assistant:

void inject_code(md::ROM& rom, World& world) override
    {
        constexpr uint8_t HitBoxXStart = 24;
        constexpr uint8_t HitBoxXEnd = 26;
        constexpr uint8_t HitBoxYStart = 28;
        constexpr uint8_t HitBoxYEnd = 30;
        constexpr uint8_t ZPos = 18;

        // A0 = address of the first entity inside draw order table being compared to others
        // A1 = address of the second entity inside draw order table being compared to A0

        md::Code func;
        func.movem_to_stack({ reg_D0_D7 }, { reg_A0_A6 });
        {
            func.lea(0xFF5400, reg_A5);
            func.lea(0xFF11DE, reg_A0);
            func.movew(0xFFFF, addr_(0xFF11FE)); // Put an "end" word at the end of the list

            // One turn of Loop_1 consists in comparing one A0 to eveyr subsequent A1. Loop_1 handles A0 value,
            // whereas changing A1 value is delegated to Loop_2.
            func.label("loop_entity_1");
            {
                // Put A1 one slot ahead of A0 to start the loop
                func.movel(reg_A0, reg_A1);
                func.addql(0x2, reg_A1);

                // Store A0 entity offset inside D0. If negative (0xFFFF), it means we reached the end of table.
                func.movew(addr_(reg_A0), reg_D0);
                func.bpl("no_ret");
                {
                    func.movem_from_stack({ reg_D0_D7 }, { reg_A0_A6 });
                    func.rts();
                }
                func.label("no_ret");

                func.lea(addrw_(reg_A5,reg_D0,HitBoxXStart), reg_A3);
                func.movew(addr_postinc_(reg_A3), reg_D2);
                func.movew(addr_postinc_(reg_A3), reg_D3);
                func.movew(addr_postinc_(reg_A3), reg_D4);
                func.movew(addr_(reg_A3), reg_D5);

                // Loop_2 consists looping A1 over every subsequent entity to A0 inside the table, comparing A0
                // to every following entity.
                func.label("loop_entity_2");
                {
                    // Store A1 entity offset inside D1. If negative (0xFFFF), it means we have finished comparing A0
                    // to all entities ahead of it, so we can increment A0 and go for another loop_1 turn.
                    func.movew(addr_(reg_A1), reg_D1);
                    func.bmi("next_loop_entity_1");

                    // If minX0 >= maxX1: D0 is in front of D1 -> order is good -> go to next entity
                    func.cmpw(addrw_(reg_A5,reg_D1,HitBoxXEnd), reg_D2);
                    func.bcc("next_loop_entity_2");

                    // If minY0 >= maxY1: D0 is in front of D1 -> order is good -> go to next entity
                    func.cmpw(addrw_(reg_A5,reg_D1,HitBoxYEnd), reg_D4);
                    func.bcc("next_loop_entity_2");

                    // If maxX0 < minX1: D1 is in front of D0 -> order is NOT good -> swap those two entities
                    func.cmpw(addrw_(reg_A5,reg_D1,HitBoxXStart), reg_D3);
                    func.bls("swap_a0_a1");

                    // If maxY0 < minY1: D1 is in front of D0 -> order is NOT good -> swap those two entities
                    func.cmpw(addrw_(reg_A5,reg_D1,HitBoxYStart), reg_D5);
                    func.bls("swap_a0_a1");

                    // If Z0 < Z1: D1 is in front of D0 -> order is NOT good -> swap those two entities
                    func.movew(addrw_(reg_A5,reg_D0,ZPos), reg_D6);
                    func.cmpw(addrw_(reg_A5,reg_D1,ZPos), reg_D6);
                    func.bcc("next_loop_entity_2");

                    func.label("swap_a0_a1");
                    {
                        // Swap A0 and A1 values
                        func.movew(reg_D1, addr_(reg_A0));
                        func.movew(reg_D0, addr_(reg_A1));

                        // Update D0 and related values
                        func.movew(reg_D1, reg_D0);

                        func.lea(addrw_(reg_A5,reg_D0,HitBoxXStart), reg_A3);
                        func.movew(addr_postinc_(reg_A3), reg_D2);
                        func.movew(addr_postinc_(reg_A3), reg_D3);
                        func.movew(addr_postinc_(reg_A3), reg_D4);
                        func.movew(addr_(reg_A3), reg_D5);
                    }
                    func.label("next_loop_entity_2");
                    func.addql(0x2, reg_A1);
                }
                func.bra("loop_entity_2");
            }
            func.label("next_loop_entity_1");
            func.addql(0x2, reg_A0);
            func.bra("loop_entity_1");
        }

        rom.set_code(0x49C0, func); // Replace original function
        if(0x49C0 + func.get_bytes().size() > 0x4A3A)
            throw LandstalkerException("Replacement function is too large and is overlapping other code!");
    }